

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O1

bool __thiscall
CSkins::ValidateSkinParts
          (CSkins *this,char **apPartNames,int *pUseCustomColors,int *pPartColors,int GameFlags)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  float fVar4;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 aVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  vec3 vVar17;
  vec3 HSL;
  vec3 HSL_00;
  float local_bc;
  float local_a0;
  float local_9c;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aVar10;
  
  if ((GameFlags & 1U) == 0) {
    uVar1 = *pPartColors;
    uVar2 = pPartColors[5];
    fVar4 = 0.0;
    fVar9 = 0.0;
    if (*pUseCustomColors == 0) {
      aVar11.z = 1.0;
    }
    else {
      fVar4 = (float)(uVar1 >> 0x10 & 0xff) / 255.0;
      fVar9 = (float)(uVar1 >> 8 & 0xff) / 255.0;
      aVar11.z = (float)(uVar1 & 0xff) / 255.0;
    }
    vVar17.field_1.y = fVar9;
    vVar17.field_0.x = fVar4;
    vVar17.field_2.z = aVar11.z;
    vVar17 = HslToRgb(vVar17);
    aVar11 = vVar17.field_2;
    aVar5 = vVar17.field_0;
    aVar10 = vVar17.field_1;
    fVar9 = aVar11.z * 0.0721856 + aVar5.x * 0.212656 + aVar10.y * 0.715158;
    if (fVar9 <= 0.008856) {
      local_9c = fVar9 * 7.787 + 0.137931;
    }
    else {
      local_9c = powf(fVar9,0.333333);
    }
    fVar4 = (aVar11.z * 0.180464 + aVar5.x * 0.412424 + aVar10.y * 0.357579) / 0.950467;
    if (fVar4 <= 0.008856) {
      local_bc = fVar4 * 7.787 + 0.137931;
    }
    else {
      local_bc = powf(fVar4,0.333333);
    }
    if (fVar9 <= 0.008856) {
      fVar4 = fVar9 * 7.787 + 0.137931;
    }
    else {
      fVar4 = powf(fVar9,0.333333);
    }
    if (fVar9 <= 0.008856) {
      fVar9 = fVar9 * 7.787 + 0.137931;
    }
    else {
      fVar9 = powf(fVar9,0.333333);
    }
    fVar12 = (float)(uVar2 >> 0x10 & 0xff) / 255.0;
    fVar14 = (aVar11.z * 0.950444 + aVar5.x * 0.0193324 + aVar10.y * 0.119193) / 1.088969;
    fVar16 = (float)(uVar2 >> 8 & 0xff) / 255.0;
    if (fVar14 <= 0.008856) {
      fVar14 = fVar14 * 7.787 + 0.137931;
    }
    else {
      fVar14 = powf(fVar14,0.333333);
    }
    fVar13 = (float)(uVar2 & 0xff) / 255.0;
    fVar4 = (local_bc - fVar4) * 500.0;
    fVar6 = local_9c * 116.0 + -16.0;
    fVar9 = (fVar9 - fVar14) * 200.0;
    iVar3 = str_comp(apPartNames[5],"negative");
    if (iVar3 == 0) {
      fVar14 = fVar16;
      fVar7 = fVar12;
      if (pUseCustomColors[5] == 0) {
        fVar13 = 1.0;
        fVar14 = 0.0;
        fVar7 = 0.0;
      }
      HSL_00.field_2.z = fVar13 * 0.925;
      HSL_00.field_1.y = fVar14;
      HSL_00.field_0.x = fVar7;
      vVar17 = HslToRgb(HSL_00);
      aVar11 = vVar17.field_2;
      aVar5 = vVar17.field_0;
      aVar10 = vVar17.field_1;
      fVar12 = aVar11.z * 0.0721856 + aVar5.x * 0.212656 + aVar10.y * 0.715158;
      if (fVar12 <= 0.008856) {
        local_a0 = fVar12 * 7.787 + 0.137931;
      }
      else {
        local_a0 = powf(fVar12,0.333333);
      }
      fVar16 = (aVar11.z * 0.180464 + aVar5.x * 0.412424 + aVar10.y * 0.357579) / 0.950467;
      if (fVar16 <= 0.008856) {
        fVar16 = fVar16 * 7.787 + 0.137931;
      }
      else {
        fVar16 = powf(fVar16,0.333333);
      }
      if (fVar12 <= 0.008856) {
        fVar8 = fVar12 * 7.787 + 0.137931;
      }
      else {
        fVar8 = powf(fVar12,0.333333);
      }
      if (fVar12 <= 0.008856) {
        fVar12 = fVar12 * 7.787 + 0.137931;
      }
      else {
        fVar12 = powf(fVar12,0.333333);
      }
      fVar15 = (aVar11.z * 0.950444 + aVar5.x * 0.0193324 + aVar10.y * 0.119193) / 1.088969;
      if (fVar15 <= 0.008856) {
        fVar15 = fVar15 * 7.787 + 0.137931;
      }
      else {
        fVar15 = powf(fVar15,0.333333);
      }
      fVar6 = fVar6 - (local_a0 * 116.0 + -16.0);
      fVar4 = fVar4 + (fVar16 - fVar8) * -500.0;
      fVar9 = fVar9 + (fVar12 - fVar15) * -200.0;
      fVar9 = fVar9 * fVar9 + fVar6 * fVar6 + fVar4 * fVar4;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      if (80.0 <= fVar9) {
        return true;
      }
      fVar13 = fVar13 + -0.22;
      fVar9 = 1.0;
      if (fVar13 <= 1.0) {
        fVar9 = fVar13;
      }
      fVar9 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar9);
      if (fVar9 < 0.23921569) goto LAB_0017c6f8;
      pUseCustomColors[5] = 1;
      fVar9 = fVar9 * 255.0;
    }
    else {
      iVar3 = str_comp(apPartNames[5],"colorable");
      if (iVar3 != 0) {
        return true;
      }
      fVar7 = 0.0;
      fVar14 = 0.0;
      if (pUseCustomColors[5] != 0) {
        fVar7 = fVar12;
        fVar14 = fVar16;
      }
      fVar12 = 1.0;
      if (pUseCustomColors[5] != 0) {
        fVar12 = fVar13;
      }
      aVar11.z = 1.0;
      if (fVar12 * 0.0823 <= 1.0) {
        aVar11.z = fVar12 * 0.0823;
      }
      HSL.field_1.y = fVar14;
      HSL.field_0.x = fVar7;
      HSL.field_2.z = aVar11.z;
      vVar17 = HslToRgb(HSL);
      aVar11 = vVar17.field_2;
      aVar5 = vVar17.field_0;
      aVar10 = vVar17.field_1;
      fVar16 = aVar11.z * 0.0721856 + aVar5.x * 0.212656 + aVar10.y * 0.715158;
      if (fVar16 <= 0.008856) {
        local_a0 = fVar16 * 7.787 + 0.137931;
      }
      else {
        local_a0 = powf(fVar16,0.333333);
      }
      fVar13 = (aVar11.z * 0.180464 + aVar5.x * 0.412424 + aVar10.y * 0.357579) / 0.950467;
      if (fVar13 <= 0.008856) {
        fVar13 = fVar13 * 7.787 + 0.137931;
      }
      else {
        fVar13 = powf(fVar13,0.333333);
      }
      if (fVar16 <= 0.008856) {
        fVar8 = fVar16 * 7.787 + 0.137931;
      }
      else {
        fVar8 = powf(fVar16,0.333333);
      }
      if (fVar16 <= 0.008856) {
        fVar16 = fVar16 * 7.787 + 0.137931;
      }
      else {
        fVar16 = powf(fVar16,0.333333);
      }
      fVar15 = (aVar11.z * 0.950444 + aVar5.x * 0.0193324 + aVar10.y * 0.119193) / 1.088969;
      if (fVar15 <= 0.008856) {
        fVar15 = fVar15 * 7.787 + 0.137931;
      }
      else {
        fVar15 = powf(fVar15,0.333333);
      }
      fVar6 = fVar6 - (local_a0 * 116.0 + -16.0);
      fVar4 = fVar4 + (fVar13 - fVar8) * -500.0;
      fVar9 = fVar9 + (fVar16 - fVar15) * -200.0;
      fVar9 = fVar9 * fVar9 + fVar6 * fVar6 + fVar4 * fVar4;
      if (fVar9 < 0.0) {
        fVar9 = sqrtf(fVar9);
      }
      else {
        fVar9 = SQRT(fVar9);
      }
      if (80.0 <= fVar9) {
        return true;
      }
      fVar12 = fVar12 + -0.6;
      fVar9 = 1.0;
      if (fVar12 <= 1.0) {
        fVar9 = fVar12;
      }
      pUseCustomColors[5] = 1;
      fVar9 = (float)(~-(uint)(fVar12 < 0.0) & (uint)(fVar9 * 255.0));
    }
    pPartColors[5] = (int)fVar9 | (int)(fVar14 * 255.0) << 8 | (int)(fVar7 * 255.0) << 0x10;
  }
  else {
    iVar3 = str_comp(apPartNames[5],"colorable");
    if ((iVar3 != 0) && (iVar3 = str_comp(apPartNames[5],"negative"), iVar3 != 0)) {
      return true;
    }
LAB_0017c6f8:
    str_copy(apPartNames[5],"standard",0x61);
  }
  return false;
}

Assistant:

bool CSkins::ValidateSkinParts(char *apPartNames[NUM_SKINPARTS], int *pUseCustomColors, int *pPartColors, int GameFlags) const
{
	// force standard (black) eyes on team skins
	if(GameFlags&GAMEFLAG_TEAMS)
	{
		// TODO: adjust eye color here as well?
		if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0 || str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE);
			return false;
		}
	}
	else
	{
		const int BodyColor = pPartColors[SKINPART_BODY];
		const int EyeColor = pPartColors[SKINPART_EYES];

		vec3 BodyHsl(((BodyColor>>16)&0xff)/255.0f, ((BodyColor>>8)&0xff)/255.0f, (BodyColor&0xff)/255.0f);
		vec3 EyeHsl(((EyeColor>>16)&0xff)/255.0f, ((EyeColor>>8)&0xff)/255.0f, (EyeColor&0xff)/255.0f);

		if(!pUseCustomColors[SKINPART_BODY])
			BodyHsl = vec3(0, 0, 1);

		const vec3 BodyLab = RgbToLab(HslToRgb(BodyHsl));

		if(str_comp(apPartNames[SKINPART_EYES], "negative") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l *= 0.925f;

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l = clamp(OrgEyeHsl.l - 0.22f, 0.f, 1.f);

				// white eye can't go to black because of our DARKEST_COLOR_LGT restriction, so switch to standard (black) eyes
				if(OrgEyeHsl.l < DARKEST_COLOR_LGT/255.f)
					str_copy(apPartNames[SKINPART_EYES], "standard", MAX_SKIN_ARRAY_SIZE); // black
				else
				{
					pUseCustomColors[SKINPART_EYES] = 1;
					pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));
				}

				return false;
			}
		}
		else if(str_comp(apPartNames[SKINPART_EYES], "colorable") == 0)
		{
			if(!pUseCustomColors[SKINPART_EYES])
				EyeHsl = vec3(0, 0, 1);

			vec3 OrgEyeHsl = EyeHsl;
			EyeHsl.l = clamp(EyeHsl.l * 0.0823f, 0.f, 1.f);

			const vec3 EyeLab = RgbToLab(HslToRgb(EyeHsl));
			if(distance(BodyLab, EyeLab) < MIN_EYE_BODY_COLOR_DIST)
			{
				OrgEyeHsl.l -= 0.6f;
				OrgEyeHsl.l = clamp(OrgEyeHsl.l, 0.f, 1.f);

				pUseCustomColors[SKINPART_EYES] = 1;
				pPartColors[SKINPART_EYES] = (int(OrgEyeHsl.h*255) << 16) | (int(OrgEyeHsl.s*255) << 8) | (int(OrgEyeHsl.l*255));

				return false;
			}
		}
	}

	return true;
}